

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlChar * xmlNodeListGetString(xmlDocPtr doc,xmlNode *list,int inLine)

{
  xmlChar *pxVar1;
  xmlBufPtr buf;
  int iVar2;
  uint flags;
  
  if (list == (xmlNode *)0x0) {
    return (xmlChar *)0x0;
  }
  iVar2 = 0;
  if ((inLine == 0) &&
     ((list->parent == (_xmlNode *)0x0 || (iVar2 = 2, list->parent->type != XML_ATTRIBUTE_NODE)))) {
    pxVar1 = xmlNodeListGetStringInternal(doc,list,1);
    return pxVar1;
  }
  if (((iVar2 == 0) && (list->type - XML_TEXT_NODE < 2)) && (list->next == (_xmlNode *)0x0)) {
    pxVar1 = list->content;
    if (pxVar1 == (xmlChar *)0x0) {
      pxVar1 = "";
    }
    pxVar1 = xmlStrdup(pxVar1);
    return pxVar1;
  }
  buf = xmlBufCreate(0x32);
  if (buf == (xmlBufPtr)0x0) {
LAB_0014cb25:
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    if (list != (xmlNode *)0x0) {
      do {
        if (list->type - XML_TEXT_NODE < 2) {
          pxVar1 = list->content;
          if (pxVar1 != (xmlChar *)0x0) {
            if (iVar2 == 0) {
              xmlBufCat(buf,pxVar1);
            }
            else {
              if (iVar2 == 2) {
                flags = 1;
LAB_0014caaf:
                pxVar1 = xmlEncodeEntitiesInternal(doc,pxVar1,flags);
              }
              else {
                if (iVar2 == 1) {
                  flags = 0;
                  goto LAB_0014caaf;
                }
                pxVar1 = xmlEncodeSpecialChars(doc,pxVar1);
              }
              if (pxVar1 == (xmlChar *)0x0) {
                xmlBufFree(buf);
                goto LAB_0014cb25;
              }
              xmlBufCat(buf,pxVar1);
              (*xmlFree)(pxVar1);
            }
          }
        }
        else if (list->type == XML_ENTITY_REF_NODE) {
          if (iVar2 == 0) {
            xmlBufGetNodeContent(buf,list);
          }
          else {
            xmlBufAdd(buf,(xmlChar *)"&",1);
            xmlBufCat(buf,list->name);
            xmlBufAdd(buf,";",1);
          }
        }
        list = list->next;
      } while (list != (_xmlNode *)0x0);
    }
    pxVar1 = xmlBufDetach(buf);
    xmlBufFree(buf);
  }
  return pxVar1;
}

Assistant:

xmlChar *
xmlNodeListGetString(xmlDocPtr doc, const xmlNode *list, int inLine)
{
    int escMode;

    /* backward compatibility */
    if (list == NULL)
        return(NULL);

    if (inLine) {
        escMode = 0;
    } else {
        if ((list->parent != NULL) &&
            (list->parent->type == XML_ATTRIBUTE_NODE))
            escMode = 2;
        else
            escMode = 1;
    }

    return(xmlNodeListGetStringInternal(doc, list, escMode));
}